

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O3

void __thiscall
TTD::TTDComparePath::WritePathToConsole
          (TTDComparePath *this,ThreadContext *threadContext,bool printNewline,char16 *namebuff,
          charcount_t namebuffLength)

{
  TTDComparePath *pTVar1;
  uint uVar2;
  PropertyRecord *pPVar3;
  StepKind SVar4;
  int64 iVar5;
  char16_t *pcVar6;
  char16_t *form;
  
  if (this->m_prefix != (TTDComparePath *)0x0) {
    WritePathToConsole(this->m_prefix,threadContext,false,namebuff,namebuffLength);
  }
  SVar4 = this->m_stepKind;
  if (SVar4 - PropertyData < 3) {
    pPVar3 = ThreadContext::GetPropertyName(threadContext,(PropertyId)(this->m_step).IndexOrPID);
    js_memcpy_s(namebuff,(ulong)namebuffLength * 2,pPVar3 + 1,
                (ulong)(pPVar3->byteCount & 0xfffffffe));
    uVar2 = pPVar3->byteCount >> 1;
    if (namebuffLength - 1 < uVar2) {
      uVar2 = namebuffLength - 1;
    }
    namebuff[uVar2] = L'\0';
    SVar4 = this->m_stepKind;
  }
  if (SpecialArray < SVar4) {
    TTDAbort_unrecoverable_error("Unknown tag in switch statement!!!");
  }
  pTVar1 = this->m_prefix;
  switch(SVar4) {
  case Empty:
    goto switchD_008ea4b2_caseD_0;
  case Root:
    iVar5 = (this->m_step).IndexOrPID;
    pcVar6 = L"root#%I64i";
    goto LAB_008ea579;
  case PropertyData:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    form = L"%ls%ls";
    break;
  case PropertyGetter:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    form = L"%ls<%ls";
    break;
  case PropertySetter:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    form = L"%ls>%ls";
    break;
  case Array:
    iVar5 = (this->m_step).IndexOrPID;
    pcVar6 = L"[%I64i]";
LAB_008ea579:
    Output::Print(pcVar6,iVar5);
    goto switchD_008ea4b2_caseD_0;
  case Scope:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    namebuff = (char16 *)(this->m_step).IndexOrPID;
    form = L"%ls_scope[%I64i]";
    break;
  case SlotArray:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    namebuff = (char16 *)(this->m_step).IndexOrPID;
    form = L"%ls_slots[%I64i]";
    break;
  case FunctionBody:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    namebuff = (this->m_step).OptName;
    form = L"%ls%ls";
    break;
  case Special:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    namebuff = (this->m_step).OptName;
    form = L"%ls_%ls";
    break;
  case SpecialArray:
    pcVar6 = L".";
    if (pTVar1 == (TTDComparePath *)0x0) {
      pcVar6 = L"";
    }
    Output::Print(L"%ls_%ls[%I64i]",pcVar6,(this->m_step).OptName,(this->m_step).IndexOrPID);
    goto switchD_008ea4b2_caseD_0;
  }
  Output::Print(form,pcVar6,namebuff);
switchD_008ea4b2_caseD_0:
  if (!printNewline) {
    return;
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void TTDComparePath::WritePathToConsole(ThreadContext* threadContext, bool printNewline, _Out_writes_z_(namebuffLength) char16* namebuff, charcount_t namebuffLength) const
    {
        if(this->m_prefix != nullptr)
        {
            this->m_prefix->WritePathToConsole(threadContext, false, namebuff, namebuffLength);
        }

        if(this->m_stepKind == StepKind::PropertyData || this->m_stepKind == StepKind::PropertyGetter || this->m_stepKind == StepKind::PropertySetter)
        {
            const Js::PropertyRecord* pRecord = threadContext->GetPropertyName((Js::PropertyId)this->m_step.IndexOrPID);
            js_memcpy_s(namebuff, namebuffLength * sizeof(char16), pRecord->GetBuffer(), pRecord->GetLength() * sizeof(char16));

            // Don't allow the null to be written past the end of the buffer.
            namebuff[min(namebuffLength - 1, pRecord->GetLength())] = _u('\0');
        }

        bool isFirst = (this->m_prefix == nullptr);
        switch(this->m_stepKind)
        {
        case StepKind::Empty:
            break;
        case StepKind::Root:
            Output::Print(_u("root#%I64i"), this->m_step.IndexOrPID);
            break;
        case StepKind::PropertyData:
            Output::Print(_u("%ls%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::PropertyGetter:
            Output::Print(_u("%ls<%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::PropertySetter:
            Output::Print(_u("%ls>%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::Array:
            Output::Print(_u("[%I64i]"), this->m_step.IndexOrPID);
            break;
        case StepKind::Scope:
            Output::Print(_u("%ls_scope[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.IndexOrPID);
            break;
        case StepKind::SlotArray:
            Output::Print(_u("%ls_slots[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.IndexOrPID);
            break;
        case StepKind::FunctionBody:
            Output::Print(_u("%ls%ls"), (isFirst ? _u("") : _u(".")), this->m_step.OptName);
            break;
        case StepKind::Special:
            Output::Print(_u("%ls_%ls"), (isFirst ? _u("") : _u(".")), this->m_step.OptName);
            break;
        case StepKind::SpecialArray:
            Output::Print(_u("%ls_%ls[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.OptName, this->m_step.IndexOrPID);
            break;
        default:
            TTDAssert(false, "Unknown tag in switch statement!!!");
            break;
        }

        if(printNewline)
        {
            Output::Print(_u("\n"));
        }
    }